

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void __thiscall
CPP::WriteInitialization::initializeMenu(WriteInitialization *this,DomWidget *w,QString *param_3)

{
  bool bVar1;
  DomAction *this_00;
  QTextStream *pQVar2;
  char *in_RDX;
  QStringBuilder<const_QString_&,_QLatin1String> *in_RDI;
  long in_FS_OFFSET;
  DomAction *action;
  QString menuAction;
  QString menuName;
  Driver *in_stack_ffffffffffffff80;
  DomWidget *in_stack_ffffffffffffffb0;
  Driver *in_stack_ffffffffffffffb8;
  QString local_38;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  Driver::findOrInsertWidget(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  local_38.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_38.d.size = -0x5555555555555556;
  Qt::Literals::StringLiterals::operator____L1(in_RDX,(size_t)in_stack_ffffffffffffff80);
  ::operator+((QString *)in_stack_ffffffffffffff80,(QLatin1String *)in_RDI);
  ::QStringBuilder::operator_cast_to_QString(in_RDI);
  this_00 = Driver::actionByName(in_stack_ffffffffffffff80,(QString *)in_RDI);
  if ((this_00 != (DomAction *)0x0) && (bVar1 = DomAction::hasAttributeMenu(this_00), bVar1)) {
    pQVar2 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)in_RDI[1].a,(QString *)&in_RDI[1].b.m_data);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,&local_38);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2," = ");
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,&local_20);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,(QString *)language::derefPointer);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"menuAction()");
    QTextStream::operator<<(pQVar2,(QString *)language::eol);
  }
  QString::~QString((QString *)0x134e1d);
  QString::~QString((QString *)0x134e27);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteInitialization::initializeMenu(DomWidget *w, const QString &/*parentWidget*/)
{
    const QString menuName = m_driver->findOrInsertWidget(w);
    const QString menuAction = menuName + "Action"_L1;

    const DomAction *action = m_driver->actionByName(menuAction);
    if (action && action->hasAttributeMenu()) {
        m_output << m_indent << menuAction << " = " << menuName
            << language::derefPointer << "menuAction()" << language::eol;
    }
}